

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

appender fmt::v9::detail::write_exponent<char,fmt::v9::appender>(int exp,appender it)

{
  type tVar1;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> this;
  buffer<char> *in_RSI;
  int in_EDI;
  char *d;
  char *top;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> in_stack_ffffffffffffff80;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> local_70;
  char local_61;
  char *local_60;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> local_58;
  char local_49;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> local_48;
  char local_39;
  char *local_38;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> local_30;
  undefined1 local_21;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> local_20;
  undefined1 local_15;
  int local_14;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> local_10 [2];
  
  if ((-10000 < in_EDI) && (in_EDI < 10000)) {
    local_14 = in_EDI;
    local_10[0].container = in_RSI;
    if (in_EDI < 0) {
      local_15 = 0x2d;
      local_20.container = (buffer<char> *)appender::operator++((appender *)local_10,0);
      std::back_insert_iterator<fmt::v9::detail::buffer<char>_>::operator*(&local_20);
      std::back_insert_iterator<fmt::v9::detail::buffer<char>_>::operator=
                ((back_insert_iterator<fmt::v9::detail::buffer<char>_> *)
                 in_stack_ffffffffffffff80.container,
                 (value_type *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      local_14 = -local_14;
    }
    else {
      local_21 = 0x2b;
      local_30.container = (buffer<char> *)appender::operator++((appender *)local_10,0);
      std::back_insert_iterator<fmt::v9::detail::buffer<char>_>::operator*(&local_30);
      std::back_insert_iterator<fmt::v9::detail::buffer<char>_>::operator=
                ((back_insert_iterator<fmt::v9::detail::buffer<char>_> *)
                 in_stack_ffffffffffffff80.container,
                 (value_type *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    }
    if (99 < local_14) {
      tVar1 = to_unsigned<int>(0);
      local_38 = digits2((ulong)tVar1);
      if (999 < local_14) {
        local_39 = *local_38;
        local_48.container = (buffer<char> *)appender::operator++((appender *)local_10,0);
        std::back_insert_iterator<fmt::v9::detail::buffer<char>_>::operator*(&local_48);
        std::back_insert_iterator<fmt::v9::detail::buffer<char>_>::operator=
                  ((back_insert_iterator<fmt::v9::detail::buffer<char>_> *)
                   in_stack_ffffffffffffff80.container,
                   (value_type *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      }
      local_49 = local_38[1];
      local_58.container = (buffer<char> *)appender::operator++((appender *)local_10,0);
      std::back_insert_iterator<fmt::v9::detail::buffer<char>_>::operator*(&local_58);
      std::back_insert_iterator<fmt::v9::detail::buffer<char>_>::operator=
                ((back_insert_iterator<fmt::v9::detail::buffer<char>_> *)
                 in_stack_ffffffffffffff80.container,
                 (value_type *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      local_14 = local_14 % 100;
    }
    tVar1 = to_unsigned<int>(0);
    local_60 = digits2((ulong)tVar1);
    local_61 = *local_60;
    local_70.container = (buffer<char> *)appender::operator++((appender *)local_10,0);
    std::back_insert_iterator<fmt::v9::detail::buffer<char>_>::operator*(&local_70);
    std::back_insert_iterator<fmt::v9::detail::buffer<char>_>::operator=
              ((back_insert_iterator<fmt::v9::detail::buffer<char>_> *)
               in_stack_ffffffffffffff80.container,
               (value_type *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    this.container = (buffer<char> *)appender::operator++((appender *)local_10,0);
    std::back_insert_iterator<fmt::v9::detail::buffer<char>_>::operator*
              ((back_insert_iterator<fmt::v9::detail::buffer<char>_> *)&stack0xffffffffffffff80);
    std::back_insert_iterator<fmt::v9::detail::buffer<char>_>::operator=
              ((back_insert_iterator<fmt::v9::detail::buffer<char>_> *)this.container,
               (value_type *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    return (appender)(back_insert_iterator<fmt::v9::detail::buffer<char>_>)local_10[0].container;
  }
  assert_fail((char *)in_stack_ffffffffffffff80.container,in_stack_ffffffffffffff7c,(char *)0x1c297f
             );
}

Assistant:

FMT_CONSTEXPR auto write_exponent(int exp, It it) -> It {
  FMT_ASSERT(-10000 < exp && exp < 10000, "exponent out of range");
  if (exp < 0) {
    *it++ = static_cast<Char>('-');
    exp = -exp;
  } else {
    *it++ = static_cast<Char>('+');
  }
  if (exp >= 100) {
    const char* top = digits2(to_unsigned(exp / 100));
    if (exp >= 1000) *it++ = static_cast<Char>(top[0]);
    *it++ = static_cast<Char>(top[1]);
    exp %= 100;
  }
  const char* d = digits2(to_unsigned(exp));
  *it++ = static_cast<Char>(d[0]);
  *it++ = static_cast<Char>(d[1]);
  return it;
}